

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O2

string * __thiscall
GeneratorExpressionContent::EvaluateParameters
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
  *pvVar1;
  pointer puVar2;
  cmGeneratorExpressionEvaluator *pcVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  const_iterator pit;
  string *psVar7;
  pointer puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  uint local_1d0;
  uint local_1cc;
  string *local_1c8;
  cmGeneratorExpressionNode *local_1c0;
  vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
  *local_1b8;
  vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
  *local_1b0;
  string parameter;
  
  local_1c8 = __return_storage_ptr__;
  local_1d0 = (*node->_vptr_cmGeneratorExpressionNode[5])(node);
  pit._M_current =
       (this->ParamChildren).
       super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->ParamChildren).
           super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = node;
  iVar5 = (*node->_vptr_cmGeneratorExpressionNode[4])(node);
  local_1cc = 1;
  local_1b8 = pvVar1;
  while (psVar7 = local_1c8, uVar4 = local_1d0, pit._M_current != local_1b8) {
    if ((local_1cc == local_1d0 & (byte)iVar5) == 1) {
      ProcessArbitraryContent(&parameter,this,local_1c0,identifier,context,dagChecker,pit);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parameters,
                 &parameter);
      std::__cxx11::string::~string((string *)&parameter);
      psVar7 = local_1c8;
      goto LAB_00468ed8;
    }
    parameter._M_dataplus._M_p = (pointer)&parameter.field_2;
    parameter._M_string_length = 0;
    parameter.field_2._M_local_buf[0] = '\0';
    puVar8 = ((pit._M_current)->
             super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar2 = ((pit._M_current)->
             super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_1b0 = pit._M_current;
    while (puVar8 != puVar2) {
      pcVar3 = (puVar8->_M_t).
               super___uniq_ptr_impl<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratorExpressionEvaluator_*,_std::default_delete<cmGeneratorExpressionEvaluator>_>
               .super__Head_base<0UL,_cmGeneratorExpressionEvaluator_*,_false>._M_head_impl;
      (*pcVar3->_vptr_cmGeneratorExpressionEvaluator[3])(&local_210,pcVar3,context,dagChecker);
      std::__cxx11::string::append((string *)&parameter);
      std::__cxx11::string::~string((string *)&local_210);
      psVar7 = local_1c8;
      puVar8 = puVar8 + 1;
      if (context->HadError != false) {
        (local_1c8->_M_dataplus)._M_p = (pointer)&local_1c8->field_2;
        local_1c8->_M_string_length = 0;
        (local_1c8->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::string::~string((string *)&parameter);
        return psVar7;
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parameters,
               &parameter);
    std::__cxx11::string::~string((string *)&parameter);
    local_1cc = local_1cc + 1;
    pit._M_current = local_1b0 + 1;
  }
  if (((int)local_1d0 < 1) ||
     ((long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)local_1d0)) {
    if (local_1d0 == 0xfffffffc) {
      if ((ulong)((long)(parameters->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(parameters->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_00468ed8;
      GetOriginalExpression_abi_cxx11_(&parameter,this);
      std::operator+(&local_1f0,"$<",identifier);
      std::operator+(&local_210,&local_1f0,"> expression requires one or zero parameters.");
      reportError(context,&parameter,&local_210);
    }
    else if (local_1d0 == 0xfffffffe) {
      if (0x20 < (ulong)((long)(parameters->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(parameters->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)) goto LAB_00468ed8;
      GetOriginalExpression_abi_cxx11_(&parameter,this);
      std::operator+(&local_1f0,"$<",identifier);
      std::operator+(&local_210,&local_1f0,"> expression requires at least two parameters.");
      reportError(context,&parameter,&local_210);
    }
    else {
      if ((local_1d0 != 0xffffffff) ||
         ((parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00468ed8;
      GetOriginalExpression_abi_cxx11_(&parameter,this);
      std::operator+(&local_1f0,"$<",identifier);
      std::operator+(&local_210,&local_1f0,"> expression requires at least one parameter.");
      reportError(context,&parameter,&local_210);
    }
  }
  else {
    if (local_1d0 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&parameter);
      std::operator+(&local_1f0,"$<",identifier);
      std::operator+(&local_210,&local_1f0,"> expression requires ");
      poVar6 = std::operator<<((ostream *)&parameter,(string *)&local_210);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
      poVar6 = std::operator<<(poVar6," comma separated parameters, but got ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6," instead.");
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1f0);
      GetOriginalExpression_abi_cxx11_(&local_210,this);
      std::__cxx11::stringbuf::str();
      reportError(context,&local_210,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&parameter);
      goto LAB_00468ed8;
    }
    GetOriginalExpression_abi_cxx11_(&parameter,this);
    std::operator+(&local_1f0,"$<",identifier);
    std::operator+(&local_210,&local_1f0,"> expression requires exactly one parameter.");
    reportError(context,&parameter,&local_210);
  }
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&parameter);
LAB_00468ed8:
  (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
  psVar7->_M_string_length = 0;
  (psVar7->field_2)._M_local_buf[0] = '\0';
  return psVar7;
}

Assistant:

std::string GeneratorExpressionContent::EvaluateParameters(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& parameters) const
{
  const int numExpected = node->NumExpectedParameters();
  {
    auto pit = this->ParamChildren.begin();
    const auto pend = this->ParamChildren.end();
    const bool acceptsArbitraryContent =
      node->AcceptsArbitraryContentParameter();
    int counter = 1;
    for (; pit != pend; ++pit, ++counter) {
      if (acceptsArbitraryContent && counter == numExpected) {
        parameters.push_back(this->ProcessArbitraryContent(
          node, identifier, context, dagChecker, pit));
        return std::string();
      }
      std::string parameter;
      for (const auto& pExprEval : *pit) {
        parameter += pExprEval->Evaluate(context, dagChecker);
        if (context->HadError) {
          return std::string();
        }
      }
      parameters.push_back(std::move(parameter));
    }
  }

  if ((numExpected > cmGeneratorExpressionNode::DynamicParameters &&
       static_cast<unsigned int>(numExpected) != parameters.size())) {
    if (numExpected == 0) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires no parameters.");
    } else if (numExpected == 1) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier +
                    "> expression requires "
                    "exactly one parameter.");
    } else {
      std::ostringstream e;
      e << "$<" + identifier + "> expression requires " << numExpected
        << " comma separated parameters, but got " << parameters.size()
        << " instead.";
      reportError(context, this->GetOriginalExpression(), e.str());
    }
    return std::string();
  }

  if (numExpected == cmGeneratorExpressionNode::OneOrMoreParameters &&
      parameters.empty()) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least one parameter.");
  } else if (numExpected == cmGeneratorExpressionNode::TwoOrMoreParameters &&
             parameters.size() < 2) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires at least two parameters.");
  } else if (numExpected == cmGeneratorExpressionNode::OneOrZeroParameters &&
             parameters.size() > 1) {
    reportError(context, this->GetOriginalExpression(),
                "$<" + identifier +
                  "> expression requires one or zero parameters.");
  }
  return std::string();
}